

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::AssignTempReg(LinearScan *this,Lifetime *lifetime,RegNum reg)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  undefined7 in_register_00000011;
  BVIndex index;
  
  if (0x1f < (byte)(reg - RegRAX)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe5b,"(reg > RegNOREG && reg < RegNumCount)",
                       "reg > RegNOREG && reg < RegNumCount");
    if (!bVar2) goto LAB_00532de4;
    *puVar4 = 0;
  }
  index = (BVIndex)CONCAT71(in_register_00000011,reg);
  BVar3 = BVUnitT<unsigned_long>::Test(&this->activeRegs,index);
  if (BVar3 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe5c,"(!this->activeRegs.Test(reg))","!this->activeRegs.Test(reg)");
    if (!bVar2) goto LAB_00532de4;
    *puVar4 = 0;
  }
  if ((lifetime->field_0x9c & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe5d,"(lifetime->isSpilled)","lifetime->isSpilled");
    if (!bVar2) {
LAB_00532de4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  BVUnitT<unsigned_long>::Set(&this->func->m_regsUsed,index);
  lifetime->reg = reg;
  BVUnitT<unsigned_long>::Set(&this->tempRegs,index);
  this->tempRegLifetimes[reg] = lifetime;
  RecordLoopUse(this,(Lifetime *)0x0,reg);
  return;
}

Assistant:

void
LinearScan::AssignTempReg(Lifetime * lifetime, RegNum reg)
{
    Assert(reg > RegNOREG && reg < RegNumCount);
    Assert(!this->activeRegs.Test(reg));
    Assert(lifetime->isSpilled);
    this->func->m_regsUsed.Set(reg);
    lifetime->reg = reg;
    this->tempRegs.Set(reg);
    __analysis_assume(reg > 0 && reg < RegNumCount);
    this->tempRegLifetimes[reg] = lifetime;

    this->RecordLoopUse(nullptr, reg);
}